

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.hpp
# Opt level: O0

uint util::endianness<util::big_endian>::load_alien<unsigned_int>(char *buffer)

{
  bool bVar1;
  uint32_t *in_RDI;
  uint value;
  undefined4 local_4;
  
  bVar1 = big_endian::reversed();
  if (bVar1) {
    local_4 = util::detail::byteswap(*in_RDI);
  }
  else {
    local_4 = big_endian::decode<unsigned_int>((char *)in_RDI);
  }
  return local_4;
}

Assistant:

static T load_alien(const char * buffer) {
		if(Endianness::reversed()) {
			T value;
			std::memcpy(&value, buffer, sizeof(value));
			return detail::byteswap(value);
		} else {
			return Endianness::template decode<T>(buffer);
		}
	}